

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O3

int ffl2c(int lval,char *cval,int *status)

{
  undefined2 uVar1;
  
  if (0 < *status) {
    return *status;
  }
  uVar1 = 0x54;
  if (lval == 0) {
    uVar1 = 0x46;
  }
  *(undefined2 *)cval = uVar1;
  return *status;
}

Assistant:

int ffl2c(int lval,    /* I - value to be converted to a string */
          char *cval,  /* O - character string representation of the value */
          int *status) /* IO - error status ) */
/*
  convert logical value to a null-terminated formatted string.  If the
  input value == 0, then the output character is the letter F, else
  the output character is the letter T.  The output string is null terminated.
*/
{
    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (lval)
        strcpy(cval,"T");
    else
        strcpy(cval,"F");

    return(*status);
}